

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O1

void select_statically(saucy *s,int *target,int *lmin,int *rmin)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  
  piVar3 = s->splitvar;
  iVar1 = (s->left).cfront[piVar3[s->lev]];
  *rmin = iVar1;
  *target = iVar1;
  iVar1 = (s->left).unlab[piVar3[s->lev]];
  *lmin = iVar1;
  iVar4 = (s->right).clen[*target];
  if (-1 < iVar4) {
    iVar2 = *rmin;
    iVar4 = iVar4 + iVar2;
    if (iVar4 < iVar2) {
      iVar4 = iVar2;
    }
    iVar4 = iVar4 + 1;
    do {
      if ((s->right).lab[iVar2] == (s->left).lab[iVar1]) {
        *rmin = iVar2;
        return;
      }
      iVar4 = iVar4 + -1;
    } while (iVar2 != iVar4);
  }
  return;
}

Assistant:

static void
select_statically(struct saucy *s, int *target, int *lmin, int *rmin)
{
    int i;

    *target = *rmin = s->left.cfront[s->splitvar[s->lev]];
    *lmin = s->left.unlab[s->splitvar[s->lev]];
    /* try to map identically! */
    for (i = *rmin; i <= (*rmin + s->right.clen[*target]); i++)
        if (s->right.lab[*rmin] == s->left.lab[*lmin]) {
            *rmin = i;
            break;
        }
}